

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

void __thiscall Unit::getAction(Unit *this)

{
  Vec2 pos;
  int iVar1;
  int iVar2;
  Randomizer *this_00;
  Router *this_01;
  undefined1 local_28 [8];
  Actions act;
  Unit *this_local;
  
  act.actions.super__Vector_base<Action,_std::allocator<Action>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Actions::Actions((Actions *)local_28);
  if ((this->currentTarget == -1) || (this->stat != uMoving)) {
    if (this->stat == uMoving) {
      iVar1 = GameLogic::getCurrentRound(this->logic);
      this_00 = Randomizer::getInstance();
      iVar2 = Randomizer::randWaitTime(this_00);
      this->waitUntil = iVar1 + iVar2;
      this->stat = uWaiting;
    }
    else {
      iVar1 = GameLogic::getCurrentRound(this->logic);
      if (this->waitUntil <= iVar1) {
        this->waitUntil = 99999999;
        this_01 = Router::getInstance();
        pos = Router::availablePosition(this_01);
        Actions::emplace((Actions *)local_28,SelectDestination,-1,pos);
        this->stat = uMoving;
      }
    }
    GameLogic::reportActions(this->logic,this->id,(Actions *)local_28);
  }
  Actions::~Actions((Actions *)local_28);
  return;
}

Assistant:

void Unit::getAction()
{
    Actions act;
    if (currentTarget != -1 && stat == uMoving)
        return;
    else if (stat == uMoving)
    {
        waitUntil = logic->getCurrentRound() + Randomizer::getInstance()->randWaitTime();
        stat = uWaiting;
    }
    else if (logic->getCurrentRound() >= waitUntil)
    {
        waitUntil = IINF;
        act.emplace(SelectDestination, -1, Router::getInstance()->availablePosition());
        stat = uMoving;
    }
    logic->reportActions(this->id, act);
}